

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.h
# Opt level: O3

RelationalExpr __thiscall
mp::
ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
::Convert(ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
          *this,LogicalCountExpr e,Kind kind)

{
  undefined8 uVar1;
  undefined8 uVar2;
  RelationalExpr RVar3;
  Impl *local_18;
  
  local_18 = (Impl *)0x0;
  uVar1 = *(undefined8 *)
           ((long)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_ + 8
           );
  uVar2 = *(undefined8 *)
           ((long)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_ +
           0x10);
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&(this->factory_).exprs_,&local_18);
  RVar3.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>)operator_new__(0xc0);
  *(Kind *)RVar3.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_ = kind
  ;
  ((BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> *)
  ((this->factory_).exprs_.
   super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
   ._M_impl.super__Vector_impl_data._M_finish + -1))->super_ExprBase =
       (ExprBase)RVar3.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_;
  *(undefined8 *)
   ((long)RVar3.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_ + 8) =
       uVar1;
  *(undefined8 *)
   ((long)RVar3.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_ + 0x10)
       = uVar2;
  return (RelationalExpr)
         RVar3.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_;
}

Assistant:

RelationalExpr Convert(LogicalCountExpr e, expr::Kind kind) {
    return factory_.MakeRelational(kind, e.lhs(), e.rhs());
  }